

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O2

timestamp_t __thiscall
duckdb::WindowQuantileState<duckdb::date_t>::WindowScalar<duckdb::timestamp_t,false>
          (WindowQuantileState<duckdb::date_t> *this,CursorType *data,SubFrames *frames,idx_t n,
          Vector *result,QuantileValue *q)

{
  long lVar1;
  vector<std::pair<unsigned_long,_duckdb::date_t>,_true> *dest_00;
  size_t sVar2;
  pointer this_00;
  timestamp_t tVar3;
  pointer pHVar4;
  reference pvVar5;
  InternalException *this_01;
  ulong index;
  ulong uVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  array<duckdb::date_t,_2UL> dest;
  Interpolator<false> interp;
  
  if ((QuantileSortTree *)
      (this->qst).
      super_unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::QuantileSortTree_*,_std::default_delete<duckdb::QuantileSortTree>_>
      .super__Head_base<0UL,_duckdb::QuantileSortTree_*,_false> != (QuantileSortTree *)0x0) {
    this_00 = unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>,_true>
              ::operator->(&this->qst);
    tVar3 = QuantileSortTree::WindowScalar<duckdb::date_t,duckdb::timestamp_t,false>
                      (this_00,data,frames,n,result,q);
    return (timestamp_t)tVar3.value;
  }
  if ((this->s).
      super_unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>_>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>_*,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>_>_>
      .
      super__Head_base<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>_*,_false>
      ._M_head_impl !=
      (HeadNode<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>
       *)0x0) {
    pHVar4 = unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>_>,_true>
             ::operator->(&this->s);
    sVar2 = pHVar4->_count;
    interp.desc = false;
    lVar1 = sVar2 - 1;
    auVar9._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar9._0_8_ = lVar1;
    auVar9._12_4_ = 0x45300000;
    dVar7 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * q->dbl;
    interp.RN = dVar7;
    dVar8 = floor(dVar7);
    index = (long)(dVar8 - 9.223372036854776e+18) & (long)dVar8 >> 0x3f | (long)dVar8;
    interp.FRN = index;
    dVar7 = ceil(dVar7);
    uVar6 = (long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f | (long)dVar7;
    interp.begin = 0;
    interp.CRN = uVar6;
    interp.end = sVar2;
    pHVar4 = unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>_>,_true>
             ::operator->(&this->s);
    dest_00 = &this->skips;
    duckdb_skiplistlib::skip_list::
    HeadNode<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>
    ::at(pHVar4,index,(uVar6 - index) + 1,
         &dest_00->
          super_vector<std::pair<unsigned_long,_duckdb::date_t>,_std::allocator<std::pair<unsigned_long,_duckdb::date_t>_>_>
        );
    pvVar5 = vector<std::pair<unsigned_long,_duckdb::date_t>,_true>::get<true>(dest_00,0);
    dest._M_elems[0].days = (pvVar5->second).days;
    pvVar5 = vector<std::pair<unsigned_long,_duckdb::date_t>,_true>::get<true>
                       (dest_00,(ulong)(0x10 < (ulong)((long)(this->skips).
                                                                                                                          
                                                  super_vector<std::pair<unsigned_long,_duckdb::date_t>,_std::allocator<std::pair<unsigned_long,_duckdb::date_t>_>_>
                                                  .
                                                  super__Vector_base<std::pair<unsigned_long,_duckdb::date_t>,_std::allocator<std::pair<unsigned_long,_duckdb::date_t>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(this->skips).
                                                                                                                
                                                  super_vector<std::pair<unsigned_long,_duckdb::date_t>,_std::allocator<std::pair<unsigned_long,_duckdb::date_t>_>_>
                                                  .
                                                  super__Vector_base<std::pair<unsigned_long,_duckdb::date_t>,_std::allocator<std::pair<unsigned_long,_duckdb::date_t>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
    dest._M_elems[1].days = (pvVar5->second).days;
    tVar3 = Interpolator<false>::Extract<duckdb::date_t,duckdb::timestamp_t>
                      (&interp,dest._M_elems,result);
    return (timestamp_t)tVar3.value;
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&interp,"No accelerator for scalar QUANTILE",(allocator *)&dest);
  InternalException::InternalException(this_01,(string *)&interp);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

RESULT_TYPE WindowScalar(CursorType &data, const SubFrames &frames, const idx_t n, Vector &result,
	                         const QuantileValue &q) const {
		D_ASSERT(n > 0);
		if (qst) {
			return qst->WindowScalar<INPUT_TYPE, RESULT_TYPE, DISCRETE>(data, frames, n, result, q);
		} else if (s) {
			// Find the position(s) needed
			try {
				Interpolator<DISCRETE> interp(q, s->size(), false);
				s->at(interp.FRN, interp.CRN - interp.FRN + 1, skips);
				array<INPUT_TYPE, 2> dest;
				dest[0] = skips[0].second;
				if (skips.size() > 1) {
					dest[1] = skips[1].second;
				} else {
					// Avoid UMA
					dest[1] = skips[0].second;
				}
				return interp.template Extract<INPUT_TYPE, RESULT_TYPE>(dest.data(), result);
			} catch (const duckdb_skiplistlib::skip_list::IndexError &idx_err) {
				throw InternalException(idx_err.message());
			}
		} else {
			throw InternalException("No accelerator for scalar QUANTILE");
		}
	}